

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack29_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x20000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 3;
  *puVar1 = (in[2] - base) * 0x4000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] - base >> 6;
  *puVar1 = (in[3] - base) * 0x800000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] - base >> 9;
  *puVar1 = (in[4] - base) * 0x100000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] - base >> 0xc;
  *puVar1 = (in[5] - base) * 0x20000 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] - base >> 0xf;
  *puVar1 = (in[6] - base) * 0x4000 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[6] - base >> 0x12;
  *puVar1 = (in[7] - base) * 0x800 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[7] - base >> 0x15;
  *puVar1 = (in[8] - base) * 0x100 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[8] - base >> 0x18;
  *puVar1 = (in[9] - base) * 0x20 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[9] - base >> 0x1b;
  *puVar1 = (in[10] - base) * 4 | *puVar1;
  *puVar1 = (in[0xb] - base) * -0x80000000 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xb] - base >> 1;
  *puVar1 = (in[0xc] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xc] - base >> 4;
  *puVar1 = (in[0xd] - base) * 0x2000000 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xd] - base >> 7;
  *puVar1 = (in[0xe] - base) * 0x400000 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xe] - base >> 10;
  *puVar1 = (in[0xf] - base) * 0x80000 | *puVar1;
  out[0xe] = in[0xf] - base >> 0xd;
  return out + 0xf;
}

Assistant:

uint32_t * pack29_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  26 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  23 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  28 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  25 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  16 );
    ++in;

    return out + 1;
}